

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poll_set.cpp
# Opt level: O3

__sighandler_t __thiscall miniros::PollSet::signal(PollSet *this,int __sig,__sighandler_t __handler)

{
  int iVar1;
  ulong in_RAX;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  lock_guard<std::mutex> lock;
  char b;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  iVar1 = pthread_mutex_trylock((pthread_mutex_t *)&this->signal_mutex_);
  if (iVar1 != 0) {
    return (__sighandler_t)CONCAT44(extraout_var,iVar1);
  }
  uStack_18 = uStack_18 & 0xffffffffffffff;
  write(this->signal_pipe_[1],(void *)((long)&uStack_18 + 7),1);
  iVar1 = pthread_mutex_unlock((pthread_mutex_t *)&this->signal_mutex_);
  return (__sighandler_t)CONCAT44(extraout_var_00,iVar1);
}

Assistant:

void PollSet::signal()
{
  if (signal_mutex_.try_lock())
  {
    std::lock_guard<std::mutex> lock(signal_mutex_, std::adopt_lock);
    char b = 0;
    if (write_signal(signal_pipe_[1], &b, 1) < 0)
    {
      // do nothing... this prevents warnings on gcc 4.3
    }
  }
}